

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexagons.cpp
# Opt level: O0

void drawHexagons(Mat *image,int factor)

{
  int local_d4;
  Scalar_<double> local_c8;
  Point_<int> local_98;
  Mat local_90 [100];
  int local_2c;
  int local_28;
  int col;
  int row;
  Point s;
  int y;
  int x;
  int factor_local;
  Mat *image_local;
  
  s.y = 3;
  s.x = 2;
  cv::Point_<int>::Point_((Point_<int> *)&col,factor * -3,factor * -2);
  local_28 = 0;
  while (row < 900) {
    local_2c = 0;
    for (; col < 0x5a1; col = s.y * factor * 2 + col) {
      cv::Mat::Mat(local_90,image);
      cv::Point_<int>::Point_(&local_98,(Point_<int> *)&col);
      cv::Scalar_<double>::Scalar_(&local_c8,255.0,255.0,255.0,0.0);
      drawHexagon(local_90,&local_98,&local_c8);
      cv::Mat::~Mat(local_90);
      local_2c = local_2c + 1;
    }
    row = s.x * factor * 2 + row;
    if (local_28 % 2 == 0) {
      local_d4 = 0;
    }
    else {
      local_d4 = s.y * factor;
    }
    col = local_d4;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void drawHexagons(Mat image, int factor) {
  // change x, y, factor values to increase/decrease distance between hexagons
  int x = 3;
  int y = 2;
  Point s(-x * factor, -y * factor);

  for(int row = 0; s.y < h; row++) {
    for(int col = 0; s.x <= w; col++) {
      drawHexagon(image, s, Scalar(255, 255, 255));
      s.x += x * factor * 2;
    }
    s.y += y * factor * 2;
    s.x = row % 2 ? x * factor : 0;
  }
}